

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O2

BOOL __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::SetProperty
          (CrossSiteObject<Js::SpreadArgument> *this,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  CrossSite::MarshalVar
            ((((((this->super_SpreadArgument).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,value,false);
  SpreadArgument::AssertAndFailFast(&this->super_SpreadArgument);
  return 0;
}

Assistant:

BOOL CrossSiteObject<T>::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        value = CrossSite::MarshalVar(this->GetScriptContext(), value);
        return __super::SetProperty(propertyId, value, flags, info);
    }